

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  int iVar1;
  Regexp **ppRVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  int *piVar7;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *this;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  pointer pSVar11;
  Regexp *pRVar12;
  ostream *poVar13;
  ostream *poVar14;
  __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_> *__lhs;
  long lVar15;
  LogMessage local_398;
  int local_214;
  iterator iStack_210;
  int nsuffix;
  LogMessage local_208;
  Regexp *local_88;
  Regexp *re [2];
  int i;
  int out;
  iterator iter;
  int *spliceidx;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  int *round;
  int *nsub_1;
  Regexp ***sub_1;
  undefined1 local_30 [8];
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  ParseFlags flags_local;
  int nsub_local;
  Regexp **sub_local;
  
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = flags;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = nsub;
  _flags_local = sub;
  std::vector<re2::Frame,_std::allocator<re2::Frame>_>::vector
            ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,std::allocator<re2::Frame>> *)local_30,(Regexp ***)&flags_local,
             (int *)((long)&stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
LAB_0037a31d:
  while( true ) {
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    pvVar5 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    piVar6 = &pvVar5->nsub;
    pvVar5 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    piVar7 = &pvVar5->round;
    pvVar5 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    this = &pvVar5->splices;
    pvVar5 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    iter._M_current = (Splice *)&pvVar5->spliceidx;
    bVar3 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::empty(this);
    if (bVar3) break;
    iVar1 = *(int *)&(iter._M_current)->prefix;
    sVar8 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::size(this);
    if ((int)sVar8 <= iVar1) {
      _i = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::begin(this);
      re[1]._4_4_ = 0;
      re[1]._0_4_ = 0;
      while ((int)re[1] < *piVar6) {
        while (ppRVar2 = pvVar4->sub, lVar15 = (long)(int)re[1],
              pSVar11 = __gnu_cxx::
                        __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                        ::operator->((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                                      *)&i), ppRVar2 + lVar15 < pSVar11->sub) {
          pvVar4->sub[re[1]._4_4_] = pvVar4->sub[(int)re[1]];
          re[1]._0_4_ = (int)re[1] + 1;
          re[1]._4_4_ = re[1]._4_4_ + 1;
        }
        if (*piVar7 - 1U < 2) {
          pSVar11 = __gnu_cxx::
                    __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                    ::operator->((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                                  *)&i);
          local_88 = pSVar11->prefix;
          pSVar11 = __gnu_cxx::
                    __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                    ::operator->((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                                  *)&i);
          ppRVar2 = pSVar11->sub;
          pSVar11 = __gnu_cxx::
                    __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                    ::operator->((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                                  *)&i);
          re[0] = AlternateNoFactor(ppRVar2,pSVar11->nsuffix,
                                    (ParseFlags)
                                    stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          pRVar12 = Concat(&local_88,2,
                           (ParseFlags)
                           stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
          pvVar4->sub[re[1]._4_4_] = pRVar12;
          re[1]._4_4_ = re[1]._4_4_ + 1;
          pSVar11 = __gnu_cxx::
                    __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                    ::operator->((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                                  *)&i);
          re[1]._0_4_ = pSVar11->nsub + (int)re[1];
        }
        else {
          if (*piVar7 != 3) {
            LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_208,
                       "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/parse.cc"
                       ,0x3d3);
            poVar13 = LogMessage::stream(&local_208);
            poVar14 = std::operator<<((ostream *)poVar13,"unknown round: ");
            std::ostream::operator<<(poVar14,*piVar7);
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_208);
          }
          pSVar11 = __gnu_cxx::
                    __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                    ::operator->((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                                  *)&i);
          pvVar4->sub[re[1]._4_4_] = pSVar11->prefix;
          re[1]._4_4_ = re[1]._4_4_ + 1;
          pSVar11 = __gnu_cxx::
                    __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                    ::operator->((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                                  *)&i);
          re[1]._0_4_ = pSVar11->nsub + (int)re[1];
        }
        __lhs = __gnu_cxx::
                __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                ::operator++((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                              *)&i);
        iStack_210 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::end(this);
        bVar3 = __gnu_cxx::
                operator==<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                          (__lhs,&stack0xfffffffffffffdf0);
        if (bVar3) {
          while ((int)re[1] < *piVar6) {
            pvVar4->sub[re[1]._4_4_] = pvVar4->sub[(int)re[1]];
            re[1]._0_4_ = (int)re[1] + 1;
            re[1]._4_4_ = re[1]._4_4_ + 1;
          }
        }
      }
      std::vector<re2::Splice,_std::allocator<re2::Splice>_>::clear(this);
      *piVar6 = re[1]._4_4_;
      *piVar7 = *piVar7 + 1;
      goto LAB_0037a6d4;
    }
    pvVar9 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::operator[]
                       (this,(long)*(int *)&(iter._M_current)->prefix);
    pvVar10 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::operator[]
                        (this,(long)*(int *)&(iter._M_current)->prefix);
    std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
              ((vector<re2::Frame,std::allocator<re2::Frame>> *)local_30,&pvVar9->sub,&pvVar10->nsub
              );
  }
  *piVar7 = *piVar7 + 1;
LAB_0037a6d4:
  switch(*piVar7) {
  case 1:
    FactorAlternationImpl::Round1
              (pvVar4->sub,*piVar6,
               (ParseFlags)
               stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,this);
    break;
  case 2:
    FactorAlternationImpl::Round2
              (pvVar4->sub,*piVar6,
               (ParseFlags)
               stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,this);
    break;
  case 3:
    FactorAlternationImpl::Round3
              (pvVar4->sub,*piVar6,
               (ParseFlags)
               stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,this);
    break;
  case 4:
    sVar8 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::size
                      ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    if (sVar8 == 1) {
      iVar1 = *piVar6;
      std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector
                ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
      return iVar1;
    }
    local_214 = *piVar6;
    std::vector<re2::Frame,_std::allocator<re2::Frame>_>::pop_back
              ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    iVar1 = local_214;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    pvVar5 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    pvVar9 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::operator[]
                       (&pvVar4->splices,(long)pvVar5->spliceidx);
    pvVar9->nsuffix = iVar1;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)local_30);
    pvVar4->spliceidx = pvVar4->spliceidx + 1;
    goto LAB_0037a31d;
  default:
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/parse.cc"
               ,0x3fa);
    poVar13 = LogMessage::stream(&local_398);
    poVar14 = std::operator<<((ostream *)poVar13,"unknown round: ");
    std::ostream::operator<<(poVar14,*piVar7);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_398);
  }
  bVar3 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::empty(this);
  if ((bVar3) || (*piVar7 == 3)) {
    sVar8 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::size(this);
    *(int *)&(iter._M_current)->prefix = (int)sVar8;
  }
  else {
    *(undefined4 *)&(iter._M_current)->prefix = 0;
  }
  goto LAB_0037a31d;
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}